

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrcmap.c
# Opt level: O1

FT_UInt32 pfr_cmap_char_next(PFR_CMap cmap,FT_UInt32 *pchar_code)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  FT_UInt32 FVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  uVar3 = *pchar_code + 1;
  uVar1 = cmap->num_chars;
  FVar4 = 0;
  do {
    uVar8 = 0;
    if (uVar1 != 0) {
      uVar8 = 0;
      uVar6 = uVar1;
      do {
        uVar7 = (uVar6 - uVar8 >> 1) + uVar8;
        uVar2 = cmap->chars[uVar7].char_code;
        if (uVar2 == uVar3) {
          if (uVar7 == 0) {
            uVar3 = uVar3 + 1;
            iVar5 = 2;
            FVar4 = 0;
          }
          else {
            FVar4 = uVar7 + 1;
            iVar5 = 5;
          }
          goto LAB_001489c8;
        }
        if (uVar2 < uVar3) {
          uVar8 = uVar7 + 1;
          uVar7 = uVar6;
        }
        uVar6 = uVar7;
      } while (uVar8 < uVar6);
    }
    uVar3 = 0;
    iVar5 = 0;
    if (uVar8 < uVar1) {
      iVar5 = 0;
      if (uVar8 == 0) {
        FVar4 = 0;
        uVar3 = 0;
      }
      else {
        FVar4 = uVar8 + 1;
        uVar3 = cmap->chars[uVar8].char_code;
      }
    }
LAB_001489c8:
    if (iVar5 != 2) {
      if ((iVar5 == 5) || (iVar5 == 0)) {
        *pchar_code = uVar3;
      }
      return FVar4;
    }
  } while( true );
}

Assistant:

FT_CALLBACK_DEF( FT_UInt32 )
  pfr_cmap_char_next( PFR_CMap    cmap,
                      FT_UInt32  *pchar_code )
  {
    FT_UInt    result    = 0;
    FT_UInt32  char_code = *pchar_code + 1;


  Restart:
    {
      FT_UInt   min = 0;
      FT_UInt   max = cmap->num_chars;
      FT_UInt   mid;
      PFR_Char  gchar;


      while ( min < max )
      {
        mid   = min + ( ( max - min ) >> 1 );
        gchar = cmap->chars + mid;

        if ( gchar->char_code == char_code )
        {
          result = mid;
          if ( result != 0 )
          {
            result++;
            goto Exit;
          }

          char_code++;
          goto Restart;
        }

        if ( gchar->char_code < char_code )
          min = mid + 1;
        else
          max = mid;
      }

      /* we didn't find it, but we have a pair just above it */
      char_code = 0;

      if ( min < cmap->num_chars )
      {
        gchar  = cmap->chars + min;
        result = min;
        if ( result != 0 )
        {
          result++;
          char_code = gchar->char_code;
        }
      }
    }

  Exit:
    *pchar_code = char_code;
    return result;
  }